

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_address.cpp
# Opt level: O2

void __thiscall AddressFactory_Constructor_Test::TestBody(AddressFactory_Constructor_Test *this)

{
  bool bVar1;
  AssertHelper AStack_38;
  AddressFactory factory;
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::AddressFactory(&factory);
      cfd::AddressFactory::~AddressFactory(&factory);
    }
  }
  else {
    testing::Message::Message((Message *)&factory);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x26,
               "Expected: AddressFactory factory doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&AStack_38,(Message *)&factory);
    testing::internal::AssertHelper::~AssertHelper(&AStack_38);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&factory);
  }
  return;
}

Assistant:

TEST(AddressFactory, Constructor)
{
  EXPECT_NO_THROW(AddressFactory factory);
}